

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void clean_specs(parser_hook *h)

{
  parser_spec *p;
  
  p = (parser_spec *)h->dir;
  while( true ) {
    mem_free(p);
    p = h->fhead;
    if (p == (parser_spec *)0x0) break;
    h->fhead = p->next;
    mem_free(p->name);
  }
  return;
}

Assistant:

static void clean_specs(struct parser_hook *h) {
	struct parser_spec *s;
	mem_free(h->dir);
	while (h->fhead) {
		s = h->fhead;
		h->fhead = h->fhead->next;
		mem_free((void*)s->name);
		mem_free(s);
	}
}